

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O2

void __thiscall bsim::bit_vector<17>::bit_vector(bit_vector<17> *this,string *str)

{
  int ind;
  int i;
  uint uVar1;
  
  if (str->_M_string_length == 0x11) {
    ind = 0;
    for (uVar1 = 0x10; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
      set(this,ind,(str->_M_dataplus)._M_p[uVar1] != '0');
      ind = ind + 1;
    }
    return;
  }
  __assert_fail("str.size() == N",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/bit_vector.h"
                ,0x26,"bsim::bit_vector<17>::bit_vector(const std::string &) [N = 17]");
}

Assistant:

bit_vector(const std::string& str) {
      assert(str.size() == N);

      for (int i = N - 1; i >= 0; i--) {
	unsigned char val = (str[i] == '0') ? 0 : 1;
	int ind = N - i - 1;
	set(ind, val);
      }
    }